

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_5b0ff7::HandleLockCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  undefined7 extraout_var;
  string *in_base;
  Status SVar6;
  FILE *__stream;
  cmGlobalGenerator *pcVar7;
  cmFileLockPool *this;
  uint uVar8;
  ulong uVar9;
  cmAlphaNum *this_00;
  int iVar10;
  string_view value;
  cmFileLockResult local_148;
  uint local_13c;
  pointer local_138;
  string parentDir;
  string result;
  cmAlphaNum local_f0;
  string path;
  string resultVariable;
  cmAlphaNum local_80;
  string local_50;
  
  resultVariable._M_dataplus._M_p = (pointer)&resultVariable.field_2;
  resultVariable._M_string_length = 0;
  resultVariable.field_2._M_local_buf[0] = '\0';
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    pcVar2 = status->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"sub-command LOCK requires at least two arguments.",
               (allocator<char> *)&local_80);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    bVar5 = false;
    goto LAB_002171f7;
  }
  std::__cxx11::string::string((string *)&path,(string *)(pbVar1 + 1));
  local_138 = (pointer)0xffffffffffffffff;
  iVar10 = 2;
  local_13c = 0;
  uVar9 = 2;
  bVar5 = false;
  while( true ) {
    uVar8 = (uint)uVar9;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar9)
    break;
    bVar4 = std::operator==(pbVar1 + uVar9,"DIRECTORY");
    if (bVar4) {
      bVar5 = true;
      pcVar3 = local_138;
    }
    else {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9,"RELEASE");
      if (bVar4) {
        local_13c = (uint)CONCAT71(extraout_var,1);
        pcVar3 = local_138;
      }
      else {
        bVar4 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9,"GUARD");
        if (bVar4) {
          uVar8 = uVar8 + 1;
          uVar9 = (ulong)uVar8;
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
              uVar9) {
            pcVar2 = status->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,"expected FUNCTION, FILE or PROCESS after GUARD",
                       (allocator<char> *)&local_80);
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_f0);
LAB_00217052:
            this_00 = &local_f0;
LAB_002170b9:
            std::__cxx11::string::~string((string *)this_00);
            bVar5 = false;
            goto LAB_002171ea;
          }
          bVar4 = std::operator==(pbVar1 + uVar9,"FUNCTION");
          iVar10 = 0;
          pcVar3 = local_138;
          if (!bVar4) {
            bVar4 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9,"FILE");
            if (bVar4) {
              iVar10 = 1;
              pcVar3 = local_138;
            }
            else {
              bVar4 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar9,"PROCESS");
              iVar10 = 2;
              pcVar3 = local_138;
              if (!bVar4) {
                pcVar2 = status->Makefile;
                local_f0.View_._M_len = 0x2e;
                local_f0.View_._M_str = "expected FUNCTION, FILE or PROCESS after GUARD";
                local_80.View_._M_len = 0xe;
                local_80.View_._M_str = ", but got:\n  \"";
                cmStrCat<std::__cxx11::string,char[3]>
                          (&parentDir,&local_f0,&local_80,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar9,(char (*) [3])0x67b310
                          );
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
                goto LAB_002170b4;
              }
            }
          }
        }
        else {
          bVar4 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                  "RESULT_VARIABLE");
          if (!bVar4) {
            bVar4 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9,"TIMEOUT");
            if (bVar4) {
              uVar8 = uVar8 + 1;
              uVar9 = (ulong)uVar8;
              pbVar1 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
                  uVar9) {
                pcVar2 = status->Makefile;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f0,"expected timeout value after TIMEOUT",
                           (allocator<char> *)&local_80);
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_f0);
                goto LAB_00217052;
              }
              bVar4 = cmStrToLong(pbVar1 + uVar9,(long *)&result);
              pcVar3 = result._M_dataplus._M_p;
              if (bVar4 && -1 < (long)result._M_dataplus._M_p) goto LAB_00216be2;
              pcVar2 = status->Makefile;
              local_f0.View_._M_len = 0xf;
              local_f0.View_._M_str = "TIMEOUT value \"";
              pbVar1 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_80.View_._M_str = pbVar1[uVar9]._M_dataplus._M_p;
              local_80.View_._M_len = pbVar1[uVar9]._M_string_length;
              cmStrCat<char[30]>(&parentDir,&local_f0,&local_80,
                                 (char (*) [30])"\" is not an unsigned integer.");
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
            }
            else {
              pcVar2 = status->Makefile;
              local_f0.View_._M_len = 0x37;
              local_f0.View_._M_str = "expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ";
              local_80.View_._M_len = 0x12;
              local_80.View_._M_str = "TIMEOUT\nbut got: \"";
              cmStrCat<std::__cxx11::string,char[3]>
                        (&parentDir,&local_f0,&local_80,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar9,(char (*) [3])0x67b310);
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
            }
LAB_002170b4:
            this_00 = (cmAlphaNum *)&parentDir;
            goto LAB_002170b9;
          }
          uVar8 = uVar8 + 1;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar8) {
            pcVar2 = status->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,"expected variable name after RESULT_VARIABLE",
                       (allocator<char> *)&local_80);
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_f0);
            goto LAB_00217052;
          }
          std::__cxx11::string::_M_assign((string *)&resultVariable);
          pcVar3 = local_138;
        }
      }
    }
LAB_00216be2:
    local_138 = pcVar3;
    uVar9 = (ulong)(uVar8 + 1);
  }
  if (bVar5) {
    std::__cxx11::string::append((char *)&path);
  }
  in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath((string *)&local_f0,&path,in_base);
  std::__cxx11::string::operator=((string *)&path,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  cmsys::SystemTools::GetParentDirectory(&parentDir,&path);
  SVar6 = cmsys::SystemTools::MakeDirectory(&parentDir,(mode_t *)0x0);
  if (SVar6.Kind_ == Success) {
    __stream = (FILE *)cmsys::SystemTools::Fopen(&path,"w");
    if (__stream == (FILE *)0x0) {
      pcVar2 = status->Makefile;
      local_f0.View_._M_len = 8;
      local_f0.View_._M_str = "file\n  \"";
      local_80.View_._M_len = path._M_string_length;
      local_80.View_._M_str = path._M_dataplus._M_p;
      cmStrCat<char[39]>(&result,&local_f0,&local_80,
                         (char (*) [39])"\"\ncreation failed (check permissions).");
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&result);
      goto LAB_00216e53;
    }
    fclose(__stream);
    pcVar7 = cmMakefile::GetGlobalGenerator(status->Makefile);
    cmFileLockResult::MakeOk();
    this = &pcVar7->FileLockPool;
    if ((local_13c & 1) == 0) {
      if (iVar10 == 2) {
        local_148 = cmFileLockPool::LockProcessScope(this,&path,(unsigned_long)local_138);
      }
      else if (iVar10 == 1) {
        local_148 = cmFileLockPool::LockFileScope(this,&path,(unsigned_long)local_138);
      }
      else {
        local_148 = cmFileLockPool::LockFunctionScope(this,&path,(unsigned_long)local_138);
      }
    }
    else {
      local_148 = cmFileLockPool::Release(this,&path);
    }
    cmFileLockResult::GetOutputMessage_abi_cxx11_(&result,&local_148);
    if (resultVariable._M_string_length == 0) {
      bVar5 = cmFileLockResult::IsOk(&local_148);
      if (bVar5) {
        if (resultVariable._M_string_length != 0) goto LAB_00217110;
        bVar5 = true;
      }
      else {
        pcVar2 = status->Makefile;
        local_f0.View_._M_len = 0x16;
        local_f0.View_._M_str = "error locking file\n  \"";
        local_80.View_._M_len = path._M_string_length;
        local_80.View_._M_str = path._M_dataplus._M_p;
        cmStrCat<char[3],std::__cxx11::string,char[2]>
                  (&local_50,&local_f0,&local_80,(char (*) [3])0x6736e4,&result,
                   (char (*) [2])0x678867);
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        cmSystemTools::s_FatalErrorOccurred = true;
        bVar5 = false;
      }
    }
    else {
LAB_00217110:
      bVar5 = true;
      value._M_str = result._M_dataplus._M_p;
      value._M_len = result._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,&resultVariable,value);
    }
    std::__cxx11::string::~string((string *)&result);
  }
  else {
    pcVar2 = status->Makefile;
    local_f0.View_._M_len = 0xd;
    local_f0.View_._M_str = "directory\n  \"";
    local_80.View_._M_len = parentDir._M_string_length;
    local_80.View_._M_str = parentDir._M_dataplus._M_p;
    cmStrCat<char[39]>(&result,&local_f0,&local_80,
                       (char (*) [39])"\"\ncreation failed (check permissions).");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&result);
LAB_00216e53:
    std::__cxx11::string::~string((string *)&result);
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&parentDir);
LAB_002171ea:
  std::__cxx11::string::~string((string *)&path);
LAB_002171f7:
  std::__cxx11::string::~string((string *)&resultVariable);
  return bVar5;
}

Assistant:

bool HandleLockCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard
  {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if (args.size() < 2) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command LOCK requires at least two arguments.");
    return false;
  }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i) {
    if (args[i] == "DIRECTORY") {
      directory = true;
    } else if (args[i] == "RELEASE") {
      release = true;
    } else if (args[i] == "GUARD") {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR, merr);
        return false;
      }
      if (args[i] == "FUNCTION") {
        guard = GUARD_FUNCTION;
      } else if (args[i] == "FILE") {
        guard = GUARD_FILE;
      } else if (args[i] == "PROCESS") {
        guard = GUARD_PROCESS;
      } else {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(merr, ", but got:\n  \"", args[i], "\"."));
        return false;
      }

    } else if (args[i] == "RESULT_VARIABLE") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          "expected variable name after RESULT_VARIABLE");
        return false;
      }
      resultVariable = args[i];
    } else if (args[i] == "TIMEOUT") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR, "expected timeout value after TIMEOUT");
        return false;
      }
      long scanned;
      if (!cmStrToLong(args[i], &scanned) || scanned < 0) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("TIMEOUT value \"", args[i],
                   "\" is not an unsigned integer."));
        return false;
      }
      timeout = static_cast<unsigned long>(scanned);
    } else {
      status.GetMakefile().IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ",
                 "TIMEOUT\nbut got: \"", args[i], "\"."));
      return false;
    }
  }

  if (directory) {
    path += "/cmake.lock";
  }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(
    path, status.GetMakefile().GetCurrentSourceDirectory());

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir)) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("directory\n  \"", parentDir,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  FILE* file = cmsys::SystemTools::Fopen(path, "w");
  if (!file) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("file\n  \"", path,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool =
    status.GetMakefile().GetGlobalGenerator()->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release) {
    fileLockResult = lockPool.Release(path);
  } else {
    switch (guard) {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccurred();
        return false;
    }
  }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("error locking file\n  \"", path, "\"\n", result, "."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!resultVariable.empty()) {
    status.GetMakefile().AddDefinition(resultVariable, result);
  }

  return true;
#else
  static_cast<void>(args);
  status.SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}